

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

container_t * container_from_range(uint8_t *type,uint32_t min,uint32_t max,uint16_t step)

{
  uint size;
  container_t *pcVar1;
  array_container_t *arr;
  undefined6 in_register_0000000a;
  
  if ((int)CONCAT62(in_register_0000000a,step) == 1) {
    pcVar1 = container_range_of_ones(min,max,type);
    return pcVar1;
  }
  size = (~min + max + (uint)step) / (uint)step;
  if ((int)size < 0x1001) {
    *type = '\x02';
    arr = array_container_create_given_capacity(size);
    array_container_add_from_range(arr,min,max,step);
    if (arr->cardinality != size) {
      __assert_fail("array->cardinality == size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x114f,
                    "container_t *container_from_range(uint8_t *, uint32_t, uint32_t, uint16_t)");
    }
  }
  else {
    *type = '\x01';
    arr = (array_container_t *)bitset_container_create();
    bitset_container_add_from_range((bitset_container_t *)arr,min,max,step);
    if (arr->cardinality != size) {
      __assert_fail("bitset->cardinality == size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1155,
                    "container_t *container_from_range(uint8_t *, uint32_t, uint32_t, uint16_t)");
    }
  }
  return arr;
}

Assistant:

static inline container_t *container_from_range(
    uint8_t *type, uint32_t min,
    uint32_t max, uint16_t step
){
    if (step == 0) return NULL;  // being paranoid
    if (step == 1) {
        return container_range_of_ones(min,max,type);
        // Note: the result is not always a run (need to check the cardinality)
        //*type = RUN_CONTAINER_TYPE;
        //return run_container_create_range(min, max);
    }
    int size = (max - min + step - 1) / step;
    if (size <= DEFAULT_MAX_SIZE) {  // array container
        *type = ARRAY_CONTAINER_TYPE;
        array_container_t *array = array_container_create_given_capacity(size);
        array_container_add_from_range(array, min, max, step);
        assert(array->cardinality == size);
        return array;
    } else {  // bitset container
        *type = BITSET_CONTAINER_TYPE;
        bitset_container_t *bitset = bitset_container_create();
        bitset_container_add_from_range(bitset, min, max, step);
        assert(bitset->cardinality == size);
        return bitset;
    }
}